

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

void __thiscall vmips::Function::add_ret(Function *this)

{
  element_type *peVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  undefined1 local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (add_ret()::ending == '\0') {
    iVar2 = __cxa_guard_acquire(&add_ret()::ending);
    if (iVar2 != 0) {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"j ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_60);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80.field_2._8_8_ = plVar3[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_80._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::operator+(&local_40,&local_80,&this->name);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_a0.field_2._M_allocated_capacity = *psVar4;
        local_a0.field_2._8_8_ = plVar3[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar4;
        local_a0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_a0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<vmips::text,std::allocator<vmips::text>,std::__cxx11::string>
                (&add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(text **)&add_ret::ending,(allocator<vmips::text> *)&local_a1,
                 &local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      __cxa_atexit(std::__shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &add_ret::ending,&__dso_handle);
      __cxa_guard_release(&add_ret()::ending);
    }
  }
  peVar1 = (this->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0._M_dataplus._M_p =
       (pointer)add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a0._M_string_length =
       (size_type)
       add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (add_ret::ending.super___shared_ptr<vmips::text,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)&peVar1->instructions,(shared_ptr<vmips::Instruction> *)&local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
  }
  return;
}

Assistant:

void Function::add_ret() {
    static auto ending = std::make_shared<text>(std::string{"j "} + ".L" + this->name + "_epilogue");
    cursor->instructions.push_back(ending);
}